

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall Diffusion::checkBeta(Diffusion *this,MultiFab **beta,int *allthere)

{
  uint *in_RDX;
  long in_RSI;
  char *in_RDI;
  int d;
  undefined1 local_25;
  undefined4 local_24;
  
  *in_RDX = (uint)(in_RSI != 0);
  if (*in_RDX != 0) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      local_25 = false;
      if (*in_RDX != 0) {
        local_25 = *(long *)(in_RSI + (long)local_24 * 8) != 0;
      }
      *in_RDX = (uint)local_25;
    }
  }
  if (*in_RDX == 0) {
    amrex::Abort_host(in_RDI);
  }
  return;
}

Assistant:

void
Diffusion::checkBeta (const MultiFab* const* beta,
                      int&                   allthere) const
{
    allthere = beta != 0;

    if (allthere)
    {
        for (int d = 0; d < AMREX_SPACEDIM; d++)
            allthere = allthere && beta[d] != 0;
    }

    if (!allthere)
        amrex::Abort("Diffusion::checkBeta(): beta must be all non-0");
}